

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O0

void Cgt_ManCollectVisited_rec(Aig_Man_t *pAig,Aig_Obj_t *pObj,Vec_Ptr_t *vVisited)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Vec_Ptr_t *vVisited_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = Aig_ObjIsCi(pObj);
  if ((iVar1 == 0) && (iVar1 = Aig_ObjIsTravIdCurrent(pAig,pObj), iVar1 == 0)) {
    Aig_ObjSetTravIdCurrent(pAig,pObj);
    iVar1 = Aig_ObjIsNode(pObj);
    if (iVar1 == 0) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cgt/cgtAig.c"
                    ,0x9e,"void Cgt_ManCollectVisited_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    pAVar2 = Aig_ObjFanin0(pObj);
    Cgt_ManCollectVisited_rec(pAig,pAVar2,vVisited);
    pAVar2 = Aig_ObjFanin1(pObj);
    Cgt_ManCollectVisited_rec(pAig,pAVar2,vVisited);
    Vec_PtrPush(vVisited,pObj);
  }
  return;
}

Assistant:

void Cgt_ManCollectVisited_rec( Aig_Man_t * pAig, Aig_Obj_t * pObj, Vec_Ptr_t * vVisited )
{
    if ( Aig_ObjIsCi(pObj) )
        return;
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    assert( Aig_ObjIsNode(pObj) );
    Cgt_ManCollectVisited_rec( pAig, Aig_ObjFanin0(pObj), vVisited );
    Cgt_ManCollectVisited_rec( pAig, Aig_ObjFanin1(pObj), vVisited );
    Vec_PtrPush( vVisited, pObj );
}